

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O0

Result ReadAndInstantiateModule(char *module_filename,Errors *errors,Ptr *out_instance)

{
  bool bVar1;
  pointer log_stream;
  uchar *data;
  size_type size;
  pointer *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pEVar2;
  FuncType *pFVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Ref store;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  Ptr *out_trap;
  string_view filename;
  Ptr local_4a0;
  undefined1 local_488 [8];
  RefPtr<wabt::interp::Trap> trap;
  anon_class_104_3_debff8ec local_468;
  Callback local_400;
  FuncType local_3e0;
  undefined1 local_3a0 [8];
  Ptr host_func;
  string import_name;
  FuncType func_type;
  ImportDesc *import;
  iterator __end1;
  iterator __begin1;
  vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_> *__range1;
  RefVec imports;
  undefined1 local_1d0 [8];
  Ptr module;
  undefined1 local_1b0 [8];
  ReadBinaryOptions options;
  undefined1 local_188 [5];
  bool kFailOnCustomSectionError;
  bool kStopOnFirstError;
  bool kReadDebugNames;
  ModuleDesc module_desc;
  string_view local_60;
  Enum local_4c;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  FileStream *stream;
  Ptr *out_instance_local;
  Errors *errors_local;
  char *module_filename_local;
  
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                          (&s_stdout_stream);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  wabt::string_view::string_view(&local_60,module_filename);
  filename.size_ = (size_type)local_48;
  filename.data_ = (char *)local_60.size_;
  local_4c = (Enum)wabt::ReadFile((wabt *)local_60.data_,filename,in_RCX);
  bVar1 = wabt::Failed((Result)local_4c);
  if (bVar1) {
    wabt::Result::Result((Result *)((long)&module_filename_local + 4),Error);
    module_desc.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    wabt::interp::ModuleDesc::ModuleDesc((ModuleDesc *)local_188);
    options._31_1_ = 1;
    options._30_1_ = 1;
    options._29_1_ = 1;
    log_stream = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                           (&s_log_stream);
    out_trap = (Ptr *)0x1;
    wabt::ReadBinaryOptions::ReadBinaryOptions
              ((ReadBinaryOptions *)local_1b0,&s_features,&log_stream->super_Stream,true,true,true);
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    module.root_index_._4_4_ =
         wabt::interp::ReadBinaryInterp
                   (data,size,(ReadBinaryOptions *)local_1b0,errors,(ModuleDesc *)local_188);
    bVar1 = wabt::Failed(module.root_index_._4_4_);
    if (bVar1) {
      wabt::Result::Result((Result *)((long)&module_filename_local + 4),Error);
      module_desc.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      if (s_verbose != 0) {
        wabt::interp::Istream::Disassemble
                  ((Istream *)
                   &module_desc.datas.
                    super__Vector_base<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (Stream *)
                   file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      wabt::interp::ModuleDesc::ModuleDesc
                ((ModuleDesc *)
                 &imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ModuleDesc *)local_188);
      wabt::interp::Module::New
                ((Ptr *)local_1d0,&s_store,
                 (ModuleDesc *)
                 &imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      wabt::interp::ModuleDesc::~ModuleDesc
                ((ModuleDesc *)
                 &imports.super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
                ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&__range1);
      this = &module_desc.func_types.
              super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
      __end1 = std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::
               begin((vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_> *)
                     this);
      import = (ImportDesc *)
               std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>::end
                         ((vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
                           *)this);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<wabt::interp::ImportDesc_*,_std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>_>
                                         *)&import), bVar1) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __gnu_cxx::
                __normal_iterator<wabt::interp::ImportDesc_*,_std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>_>
                ::operator*(&__end1);
        pEVar2 = std::
                 unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                 ::operator->((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                               *)(__lhs + 2));
        if ((pEVar2->kind == First) &&
           (((((s_host_print & 1U) != 0 && (bVar1 = std::operator==(__lhs,"host"), bVar1)) &&
             (bVar1 = std::operator==(__lhs + 1,"print"), bVar1)) ||
            ((s_dummy_import_func & 1U) != 0)))) {
          pEVar2 = std::
                   unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                   ::get((unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                          *)(__lhs + 2));
          pFVar3 = wabt::cast<wabt::interp::FuncType,wabt::interp::ExternType>(pEVar2);
          wabt::interp::FuncType::FuncType((FuncType *)((long)&import_name.field_2 + 8),pFVar3);
          uVar4 = std::__cxx11::string::c_str();
          uVar5 = std::__cxx11::string::c_str();
          wabt::StringPrintf_abi_cxx11_((string *)&host_func.root_index_,"%s.%s",uVar4,uVar5);
          wabt::interp::FuncType::FuncType(&local_3e0,(FuncType *)((long)&import_name.field_2 + 8));
          local_468.stream =
               (FileStream *)
               file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::string
                    ((string *)&local_468.import_name,(string *)&host_func.root_index_);
          wabt::interp::FuncType::FuncType
                    (&local_468.func_type,(FuncType *)((long)&import_name.field_2 + 8));
          std::
          function<wabt::Result(std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
          ::
          function<ReadAndInstantiateModule(char_const*,std::vector<wabt::Error,std::allocator<wabt::Error>>*,wabt::interp::RefPtr<wabt::interp::Instance>*)::__0,void>
                    ((function<wabt::Result(std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
                      *)&local_400,&local_468);
          wabt::interp::HostFunc::New((Ptr *)local_3a0,&s_store,&local_3e0,&local_400);
          std::
          function<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
          ::~function(&local_400);
          ReadAndInstantiateModule(char_const*,std::vector<wabt::Error,std::allocator<wabt::Error>>*,wabt::interp::RefPtr<wabt::interp::Instance>*)
          ::$_0::~__0((__0 *)&local_468);
          wabt::interp::FuncType::~FuncType(&local_3e0);
          trap.root_index_ =
               (Index)wabt::interp::RefPtr<wabt::interp::HostFunc>::ref
                                ((RefPtr<wabt::interp::HostFunc> *)local_3a0);
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&__range1,
                     (value_type *)&trap.root_index_);
          module_desc.istream.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = 7;
          wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr
                    ((RefPtr<wabt::interp::HostFunc> *)local_3a0);
          std::__cxx11::string::~string((string *)&host_func.root_index_);
          wabt::interp::FuncType::~FuncType((FuncType *)((long)&import_name.field_2 + 8));
        }
        else {
          std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
                    ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&__range1,
                     (value_type *)&wabt::interp::Ref::Null);
        }
        __gnu_cxx::
        __normal_iterator<wabt::interp::ImportDesc_*,_std::vector<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>_>
        ::operator++(&__end1);
      }
      wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)local_488);
      store = wabt::interp::RefPtr<wabt::interp::Module>::ref
                        ((RefPtr<wabt::interp::Module> *)local_1d0);
      wabt::interp::Instance::Instantiate
                (&local_4a0,(Instance *)&s_store,(Store *)store.index,(Ref)&__range1,
                 (RefVec *)local_488,out_trap);
      wabt::interp::RefPtr<wabt::interp::Instance>::operator=(out_instance,&local_4a0);
      wabt::interp::RefPtr<wabt::interp::Instance>::~RefPtr(&local_4a0);
      bVar1 = wabt::interp::RefPtr::operator_cast_to_bool((RefPtr *)out_instance);
      if (bVar1) {
        wabt::Result::Result((Result *)((long)&module_filename_local + 4),Ok);
      }
      else {
        wabt::interp::WriteTrap
                  ((Stream *)
                   file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,"error initialiazing module",
                   (Ptr *)local_488);
        wabt::Result::Result((Result *)((long)&module_filename_local + 4),Error);
      }
      module_desc.istream.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr((RefPtr<wabt::interp::Trap> *)local_488);
      std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector
                ((vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> *)&__range1);
      wabt::interp::RefPtr<wabt::interp::Module>::~RefPtr((RefPtr<wabt::interp::Module> *)local_1d0)
      ;
    }
    wabt::interp::ModuleDesc::~ModuleDesc((ModuleDesc *)local_188);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return (Result)module_filename_local._4_4_;
}

Assistant:

Result ReadAndInstantiateModule(const char* module_filename,
                                Errors* errors,
                                Instance::Ptr* out_instance) {
  auto* stream = s_stdout_stream.get();
  std::vector<uint8_t> file_data;
  CHECK_RESULT(ReadFile(module_filename, &file_data));

  ModuleDesc module_desc;
  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = true;
  ReadBinaryOptions options(s_features, s_log_stream.get(), kReadDebugNames,
                            kStopOnFirstError, kFailOnCustomSectionError);
  CHECK_RESULT(ReadBinaryInterp(file_data.data(), file_data.size(), options,
                                errors, &module_desc));

  if (s_verbose) {
    module_desc.istream.Disassemble(stream);
  }

  auto module = Module::New(s_store, module_desc);

  RefVec imports;
  for (auto&& import : module_desc.imports) {
    if (import.type.type->kind == ExternKind::Func &&
        ((s_host_print && import.type.module == "host" &&
          import.type.name == "print") ||
         s_dummy_import_func)) {
      auto func_type = *cast<FuncType>(import.type.type.get());
      auto import_name = StringPrintf("%s.%s", import.type.module.c_str(),
                                      import.type.name.c_str());

      auto host_func =
          HostFunc::New(s_store, func_type,
                        [=](const Values& params, Values& results,
                            Trap::Ptr* trap) -> Result {
                          printf("called host ");
                          WriteCall(stream, import_name, func_type, params,
                                    results, *trap);
                          return Result::Ok;
                        });
      imports.push_back(host_func.ref());
      continue;
    }

    // By default, just push an null reference. This won't resolve, and
    // instantiation will fail.
    imports.push_back(Ref::Null);
  }

  RefPtr<Trap> trap;
  *out_instance = Instance::Instantiate(s_store, module.ref(), imports, &trap);
  if (!*out_instance) {
    // TODO: change to "initializing"
    WriteTrap(stream, "error initialiazing module", trap);
    return Result::Error;
  }

  return Result::Ok;
}